

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_smcard.c
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  void *__ptr;
  FILE *pFVar4;
  size_t sVar5;
  char *__format;
  ulong uVar6;
  char **ppcVar7;
  
  if (argc < 2) {
    printf("Usage:\n\tmm_smcard mm_table_%02x.bin [outputfile.bin]\n",0x5d);
    return -1;
  }
  pcVar3 = table_to_string(']');
  printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n",pcVar3,0x5d,0x5d);
  __ptr = calloc(1,0xe1);
  if (__ptr == (void *)0x0) {
    printf("Failed to allocate %zu bytes.\n",0xe1);
    return -0xc;
  }
  pFVar4 = fopen(argv[1],"rb");
  if (pFVar4 == (FILE *)0x0) {
    pcVar3 = argv[1];
    __format = "Error opening %s\n";
LAB_00104359:
    printf(__format,pcVar3);
    free(__ptr);
    iVar2 = -2;
  }
  else {
    iVar2 = mm_validate_table_fsize(']',(FILE *)pFVar4,0xe0);
    if (iVar2 == 0) {
      sVar5 = fread((void *)((long)__ptr + 1),0xe0,1,pFVar4);
      if (sVar5 == 1) {
        fclose(pFVar4);
        puts(
            "+--------------------------+\n| Idx | DES Key            |\n+--------------------------+"
            );
        for (uVar6 = 0; uVar6 != 0x14; uVar6 = uVar6 + 1) {
          printf("|  %2d | 0x%016lx |\n",uVar6 & 0xffffffff,
                 *(undefined8 *)((long)__ptr + uVar6 * 8 + 1));
        }
        puts("+--------------------------+");
        puts("\n+-----+------+-----------+\n| Idx | Mult | Max Units |\n+-----+------+-----------+")
        ;
        for (uVar6 = 0; uVar6 != 0xf; uVar6 = uVar6 + 1) {
          uVar1 = *(ushort *)((long)__ptr + uVar6 * 2 + 0xa1);
          uVar1 = uVar1 << 8 | uVar1 >> 8;
          printf("|  %2d |  %2d  |     %5d |\n",uVar6 & 0xffffffff,(ulong)(uint)mult_lut[uVar1 & 3],
                 (ulong)(uVar1 >> 2));
        }
        puts("+------------------------+");
        puts(
            "\n+-----+-------------------------------+---------+\n| Idx | Rebate Type                   | Rebate  |\n+-----+-------------------------------+---------+"
            );
        ppcVar7 = str_smcard_rebate;
        for (uVar6 = 0; uVar6 != 0xe; uVar6 = uVar6 + 1) {
          printf("|  %2d | %s | $%6.2f |\n",
                 SUB84((double)((float)*(ushort *)((long)__ptr + uVar6 * 2 + 0xbf) / 100.0),0),
                 uVar6 & 0xffffffff,*ppcVar7);
          ppcVar7 = ppcVar7 + 1;
        }
        puts("+-----------------------------------------------+");
        iVar2 = 0;
        if (argc == 2) {
          pFVar4 = (FILE *)0x0;
LAB_0010449e:
          *(undefined8 *)((long)__ptr + 1) = 0xffffffffffffffff;
          *(undefined8 *)((long)__ptr + 9) = 0;
          *(undefined8 *)((long)__ptr + 0x11) = 0x7f7f7f7f7f7f7f7f;
          *(undefined8 *)((long)__ptr + 0x19) = 0xfefefefefefefefe;
          *(undefined4 *)((long)__ptr + 0xa1) = 0xf1005100;
          *(undefined4 *)((long)__ptr + 0xa5) = 0x7103a501;
          *(undefined4 *)((long)__ptr + 0xa9) = 0xa10ae106;
          *(undefined4 *)((long)__ptr + 0xad) = 0x91010100;
          *(undefined4 *)((long)__ptr + 0xb1) = 0x41062103;
          if (pFVar4 != (FILE *)0x0) {
            iVar2 = 0;
            printf("\nWriting new table to %s\n",argv[2]);
            sVar5 = fwrite((void *)((long)__ptr + 1),0xe0,1,pFVar4);
            if (sVar5 != 1) {
              printf("Error writing output file %s\n",argv[2]);
              iVar2 = -5;
            }
            fclose(pFVar4);
          }
          free(__ptr);
          return iVar2;
        }
        pFVar4 = fopen(argv[2],"wb");
        if (pFVar4 != (FILE *)0x0) goto LAB_0010449e;
        pcVar3 = argv[2];
        __format = "Error opening output file %s for write.\n";
        goto LAB_00104359;
      }
      pcVar3 = table_to_string(']');
      printf("Error reading %s table.\n",pcVar3);
    }
    free(__ptr);
    fclose(pFVar4);
    iVar2 = -5;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[]) {
    FILE *instream;
    FILE *ostream = NULL;
    int   index;
    int   ret = 0;

    dlog_mt_scard_parm_table_t *ptable;
    uint8_t* load_buffer;

    if (argc <= 1) {
        printf("Usage:\n" \
               "\tmm_smcard mm_table_%02x.bin [outputfile.bin]\n", TABLE_ID);
        return -1;
    }

    printf("Nortel Millennium %s Table %d (0x%02x) Dump\n\n", table_to_string(TABLE_ID), TABLE_ID, TABLE_ID);

    ptable = (dlog_mt_scard_parm_table_t *)calloc(1, sizeof(dlog_mt_scard_parm_table_t));

    if (ptable == NULL) {
        printf("Failed to allocate %zu bytes.\n", sizeof(dlog_mt_scard_parm_table_t));
        return -ENOMEM;
    }

    if ((instream = fopen(argv[1], "rb")) == NULL) {
        printf("Error opening %s\n", argv[1]);
        free(ptable);
        return -ENOENT;
    }

    if (mm_validate_table_fsize(TABLE_ID, instream, sizeof(dlog_mt_scard_parm_table_t) - 1) != 0) {
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    load_buffer = ((uint8_t*)ptable) + 1;
    if (fread(load_buffer, sizeof(dlog_mt_scard_parm_table_t) - 1, 1, instream) != 1) {
        printf("Error reading %s table.\n", table_to_string(TABLE_ID));
        free(ptable);
        fclose(instream);
        return -EIO;
    }

    fclose(instream);

    printf("+--------------------------+\n" \
           "| Idx | DES Key            |\n" \
           "+--------------------------+\n");

    for (index = 0; index < SC_DES_KEY_MAX; index++) {
        printf("|  %2d | 0x%016" PRIx64 " |\n",
               index,
               LE64(ptable->des_key[index]));
    }
    printf("+--------------------------+\n");

    printf("\n+-----+------+-----------+\n" \
           "| Idx | Mult | Max Units |\n"   \
           "+-----+------+-----------+\n");

    for (index = 0; index < SC_MULT_MAX_UNIT_MAX; index++) {
        int multiplier = mult_lut[(htons(LE16(ptable->mult_max_unit[index])) & SC_MULT_MASK)];
        int max_units  = htons(LE16(ptable->mult_max_unit[index])) >> SC_MAX_UNIT_SHIFT;

        printf("|  %2d |  %2d  |     %5d |\n", index, multiplier, max_units);
    }

    printf("+------------------------+\n");

    printf("\n+-----+-------------------------------+---------+\n" \
           "| Idx | Rebate Type                   | Rebate  |\n"   \
           "+-----+-------------------------------+---------+\n");

    for (index = 0; index < SC_REBATE_MAX; index++) {
        int rebate = LE16(ptable->rebates[index]);

        printf("|  %2d | %s | $%6.2f |\n", index, str_smcard_rebate[index], (float)rebate / 100);
    }

    printf("+-----------------------------------------------+\n");

    if (argc > 2) {
        if ((ostream = fopen(argv[2], "wb")) == NULL) {
            printf("Error opening output file %s for write.\n", argv[2]);
            free(ptable);
            return -ENOENT;
        }
    }

    /* Modify SMCARD table */
    ptable->des_key[0] = LE64(0xFFFFFFFFFFFFFFFFULL);
    ptable->des_key[1] = LE64(0ULL);
    ptable->des_key[2] = LE64(0x7F7F7F7F7F7F7F7FULL);
    ptable->des_key[3] = LE64(0xFEFEFEFEFEFEFEFEULL);

    ptable->mult_max_unit[0] = htons(LE16(20  << 2 | 0x01));   // 20
    ptable->mult_max_unit[1] = htons(LE16(60  << 2 | 0x01));   // 60
    ptable->mult_max_unit[2] = htons(LE16(105 << 2 | 0x01));   // 105
    ptable->mult_max_unit[3] = htons(LE16(220 << 2 | 0x01));   // 220
    ptable->mult_max_unit[4] = htons(LE16(440 << 2 | 0x01));   // 440
    ptable->mult_max_unit[5] = htons(LE16(680 << 2 | 0x01));   // 680
    ptable->mult_max_unit[6] = htons(LE16(0   << 2 | 0x01));   // 0
    ptable->mult_max_unit[7] = htons(LE16(100 << 2 | 0x01));   // 100
    ptable->mult_max_unit[8] = htons(LE16(200 << 2 | 0x01));   // 200
    ptable->mult_max_unit[9] = htons(LE16(400 << 2 | 0x01));   // 400

    /* If output file was specified, write it. */
    if (ostream != NULL) {
        printf("\nWriting new table to %s\n", argv[2]);

        if (fwrite(load_buffer, sizeof(dlog_mt_scard_parm_table_t) - 1, 1, ostream) != 1) {
            printf("Error writing output file %s\n", argv[2]);
            ret = -EIO;
        }
        fclose(ostream);
    }

    free(ptable);

    return ret;
}